

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

void Abc_FrameReplaceCex(Abc_Frame_t *pAbc,Abc_Cex_t **ppCex)

{
  Abc_Cex_t **ppCex_local;
  Abc_Frame_t *pAbc_local;
  
  if (pAbc->pCex != (Abc_Cex_t *)0x0) {
    free(pAbc->pCex);
    pAbc->pCex = (Abc_Cex_t *)0x0;
  }
  pAbc->pCex = *ppCex;
  *ppCex = (Abc_Cex_t *)0x0;
  if (pAbc->vCexVec != (Vec_Ptr_t *)0x0) {
    Vec_PtrFreeFree(pAbc->vCexVec);
    pAbc->vCexVec = (Vec_Ptr_t *)0x0;
  }
  return;
}

Assistant:

void Abc_FrameReplaceCex( Abc_Frame_t * pAbc, Abc_Cex_t ** ppCex )
{
    // update CEX
    ABC_FREE( pAbc->pCex );
    pAbc->pCex = *ppCex;
    *ppCex = NULL;
    // remove CEX vector
    if ( pAbc->vCexVec )
    {
        Vec_PtrFreeFree( pAbc->vCexVec );
        pAbc->vCexVec = NULL;
    }
}